

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDBusUnixFileDescriptor>::emplace<QDBusUnixFileDescriptor_const&>
          (QMovableArrayOps<QDBusUnixFileDescriptor> *this,qsizetype i,QDBusUnixFileDescriptor *args
          )

{
  QDBusUnixFileDescriptor **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QDBusUnixFileDescriptor tmp;
  Inserter local_58;
  QDBusUnixFileDescriptor local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
           super_QArrayDataPointer<QDBusUnixFileDescriptor>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_001848c0:
    local_30.d.d.ptr = (Data)&DAT_aaaaaaaaaaaaaaaa;
    QDBusUnixFileDescriptor::QDBusUnixFileDescriptor(&local_30,args);
    bVar5 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
            super_QArrayDataPointer<QDBusUnixFileDescriptor>.size != 0;
    QArrayDataPointer<QDBusUnixFileDescriptor>::detachAndGrow
              ((QArrayDataPointer<QDBusUnixFileDescriptor> *)this,(uint)(i == 0 && bVar5),1,
               (QDBusUnixFileDescriptor **)0x0,(QArrayDataPointer<QDBusUnixFileDescriptor> *)0x0);
    if (i == 0 && bVar5) {
      QDBusUnixFileDescriptor::QDBusUnixFileDescriptor
                ((this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                 super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr + -1,&local_30);
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                 super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                super_QArrayDataPointer<QDBusUnixFileDescriptor>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_58.displaceTo =
           (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
           super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr;
      local_58.displaceFrom = local_58.displaceTo + i;
      local_58.displaceTo = local_58.displaceTo + i + 1;
      local_58.nInserts = 1;
      local_58.bytes =
           ((this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
            super_QArrayDataPointer<QDBusUnixFileDescriptor>.size - i) * 8;
      local_58.data = (QArrayDataPointer<QDBusUnixFileDescriptor> *)this;
      memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
      QDBusUnixFileDescriptor::QDBusUnixFileDescriptor(local_58.displaceFrom,&local_30);
      local_58.displaceFrom = local_58.displaceFrom + 1;
      Inserter::~Inserter(&local_58);
    }
    QDBusUnixFileDescriptor::~QDBusUnixFileDescriptor(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
            super_QArrayDataPointer<QDBusUnixFileDescriptor>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                      super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QDBusUnixFileDescriptor::QDBusUnixFileDescriptor
                ((this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                 super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QDBusUnixFileDescriptor *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
          super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr)) goto LAB_001848c0;
      QDBusUnixFileDescriptor::QDBusUnixFileDescriptor
                ((this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                 super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                 super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
              super_QArrayDataPointer<QDBusUnixFileDescriptor>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }